

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_from_range(uint64_t min,uint64_t max,uint32_t step)

{
  uint uVar1;
  uint64_t uVar2;
  container_t *c;
  uint32_t gap;
  container_t *container;
  uint uStack_48;
  uint8_t type;
  uint32_t container_max;
  uint32_t container_min;
  uint32_t key;
  uint64_t min_tmp;
  roaring_array_t *prStack_30;
  uint32_t value;
  roaring_bitmap_t *answer;
  uint64_t uStack_20;
  uint32_t step_local;
  uint64_t max_local;
  uint64_t min_local;
  
  uStack_20 = max;
  if (0xffffffff < max) {
    uStack_20 = 0x100000000;
  }
  if (step == 0) {
    min_local = 0;
  }
  else if (min < uStack_20) {
    answer._4_4_ = step;
    max_local = min;
    prStack_30 = &roaring_bitmap_create()->high_low_container;
    if (answer._4_4_ < 0x10000) {
      _container_min = max_local;
      do {
        container_max = (uint)(_container_min >> 0x10) & 0xffff;
        uStack_48 = (uint)_container_min & 0xffff;
        uVar2 = minimum_uint64(uStack_20 - (container_max << 0x10),0x10000);
        container._4_4_ = (uint32_t)uVar2;
        c = container_from_range
                      ((uint8_t *)((long)&container + 3),uStack_48,container._4_4_,
                       (uint16_t)answer._4_4_);
        ra_append(prStack_30,(uint16_t)container_max,c,container._3_1_);
        uVar1 = ((container._4_4_ - uStack_48) + answer._4_4_) - 1;
        _container_min = (uVar1 - uVar1 % answer._4_4_) + _container_min;
      } while (_container_min < uStack_20);
      min_local = (uint64_t)prStack_30;
    }
    else {
      for (min_tmp._4_4_ = (uint)max_local; min_tmp._4_4_ < uStack_20;
          min_tmp._4_4_ = answer._4_4_ + min_tmp._4_4_) {
        roaring_bitmap_add((roaring_bitmap_t *)prStack_30,min_tmp._4_4_);
      }
      min_local = (uint64_t)prStack_30;
    }
  }
  else {
    min_local = 0;
  }
  return (roaring_bitmap_t *)min_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_from_range(uint64_t min, uint64_t max,
                                            uint32_t step) {
    if(max >= UINT64_C(0x100000000)) {
        max = UINT64_C(0x100000000);
    }
    if (step == 0) return NULL;
    if (max <= min) return NULL;
    roaring_bitmap_t *answer = roaring_bitmap_create();
    if (step >= (1 << 16)) {
        for (uint32_t value = (uint32_t)min; value < max; value += step) {
            roaring_bitmap_add(answer, value);
        }
        return answer;
    }
    uint64_t min_tmp = min;
    do {
        uint32_t key = (uint32_t)min_tmp >> 16;
        uint32_t container_min = min_tmp & 0xFFFF;
        uint32_t container_max = (uint32_t)minimum_uint64(max - (key << 16), 1 << 16);
        uint8_t type;
        container_t *container = container_from_range(&type, container_min,
                                               container_max, (uint16_t)step);
        ra_append(&answer->high_low_container, key, container, type);
        uint32_t gap = container_max - container_min + step - 1;
        min_tmp += gap - (gap % step);
    } while (min_tmp < max);
    // cardinality of bitmap will be ((uint64_t) max - min + step - 1 ) / step
    return answer;
}